

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O1

PointerType __thiscall cmLinkedTree<cmDefinitions>::iterator::operator->(iterator *this)

{
  cmLinkedTree<cmDefinitions> *pcVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  
  pcVar1 = this->Tree;
  if (pcVar1 == (cmLinkedTree<cmDefinitions> *)0x0) {
    __assert_fail("this->Tree",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                  ,0x4d,
                  "PointerType cmLinkedTree<cmDefinitions>::iterator::operator->() [T = cmDefinitions]"
                 );
  }
  pcVar2 = (pcVar1->Data).super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = ((long)(pcVar1->Data).super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pcVar2 >> 3) * 0x6db6db6db6db6db7
  ;
  if ((long)(pcVar1->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(pcVar1->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3 != uVar4) {
    __assert_fail("this->Tree->UpPositions.size() == this->Tree->Data.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                  ,0x4e,
                  "PointerType cmLinkedTree<cmDefinitions>::iterator::operator->() [T = cmDefinitions]"
                 );
  }
  uVar3 = this->Position;
  if (uVar4 < uVar3) {
    __assert_fail("this->Position <= this->Tree->Data.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                  ,0x4f,
                  "PointerType cmLinkedTree<cmDefinitions>::iterator::operator->() [T = cmDefinitions]"
                 );
  }
  if (uVar3 != 0) {
    return pcVar2 + uVar3 + 0xffffffffffffffff;
  }
  __assert_fail("this->Position > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                ,0x50,
                "PointerType cmLinkedTree<cmDefinitions>::iterator::operator->() [T = cmDefinitions]"
               );
}

Assistant:

PointerType operator->()
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      assert(this->Position <= this->Tree->Data.size());
      assert(this->Position > 0);
      return this->Tree->GetPointer(this->Position - 1);
    }